

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O1

int KINBBDPrecSetup(N_Vector uu,N_Vector uscale,N_Vector fval,N_Vector fscale,void *bbd_data)

{
  long lVar1;
  KINMem kin_mem;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  sunrealtype *psVar17;
  long lVar18;
  long lVar19;
  long j;
  long lVar20;
  long lVar21;
  char *msgfmt;
  long lVar22;
  bool bVar23;
  double dVar24;
  double dVar25;
  long local_78;
  
  kin_mem = *(KINMem *)((long)bbd_data + 0x90);
  iVar9 = SUNMatZero(*(undefined8 *)((long)bbd_data + 0x40));
  if (iVar9 == 0) {
    uVar2 = *(undefined8 *)((long)bbd_data + 0x60);
    uVar3 = *(undefined8 *)((long)bbd_data + 0x68);
    uVar4 = *(undefined8 *)((long)bbd_data + 0x70);
    lVar5 = *(long *)((long)bbd_data + 0x90);
    N_VScale(0x3ff0000000000000,uu,uVar4);
    lVar10 = N_VGetArrayPointer(uu);
    lVar11 = N_VGetArrayPointer(uscale);
    lVar12 = N_VGetArrayPointer(uVar2);
    lVar13 = N_VGetArrayPointer(uVar3);
    lVar14 = N_VGetArrayPointer(uVar4);
    if ((*(code **)((long)bbd_data + 0x30) == (code *)0x0) ||
       (iVar9 = (**(code **)((long)bbd_data + 0x30))
                          (*(undefined8 *)((long)bbd_data + 0x38),uu,*(undefined8 *)(lVar5 + 0x18)),
       iVar9 == 0)) {
      iVar9 = (**(code **)((long)bbd_data + 0x28))
                        (*(undefined8 *)((long)bbd_data + 0x38),uu,uVar2,
                         *(undefined8 *)(lVar5 + 0x18));
      *(long *)((long)bbd_data + 0x88) = *(long *)((long)bbd_data + 0x88) + 1;
      if (iVar9 == 0) {
        lVar6 = *bbd_data;
        lVar7 = *(long *)((long)bbd_data + 8);
        lVar19 = lVar7 + lVar6 + 1;
        lVar20 = *(long *)((long)bbd_data + 0x38);
        if (lVar19 < *(long *)((long)bbd_data + 0x38)) {
          lVar20 = lVar19;
        }
        if (0 < lVar20) {
          local_78 = 0;
          lVar15 = 1;
          do {
            j = lVar15 + -1;
            lVar22 = *(long *)((long)bbd_data + 0x38);
            lVar16 = j;
            if (lVar15 <= lVar22) {
              do {
                dVar24 = ABS(*(double *)(lVar10 + lVar16 * 8));
                dVar25 = 1.0 / *(double *)(lVar11 + lVar16 * 8);
                if (dVar24 <= dVar25) {
                  dVar24 = dVar25;
                }
                *(double *)(lVar14 + lVar16 * 8) =
                     dVar24 * *(double *)((long)bbd_data + 0x20) + *(double *)(lVar14 + lVar16 * 8);
                lVar16 = lVar16 + lVar19;
              } while (lVar16 < lVar22);
            }
            iVar9 = (**(code **)((long)bbd_data + 0x28))
                              (lVar22,uVar4,uVar3,*(undefined8 *)(lVar5 + 0x18));
            *(long *)((long)bbd_data + 0x88) = *(long *)((long)bbd_data + 0x88) + 1;
            if (iVar9 != 0) goto LAB_0010dbda;
            lVar22 = local_78;
            if (lVar15 <= *(long *)((long)bbd_data + 0x38)) {
              do {
                *(undefined8 *)(lVar14 + j * 8) = *(undefined8 *)(lVar10 + j * 8);
                psVar17 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bbd_data + 0x40),j);
                lVar18 = j - *(long *)((long)bbd_data + 0x10);
                lVar16 = 0;
                if (0 < lVar18) {
                  lVar16 = lVar18;
                }
                lVar8 = *(long *)((long)bbd_data + 0x38);
                lVar21 = *(long *)((long)bbd_data + 0x18) + j;
                lVar1 = lVar8 + -1;
                if (lVar1 <= lVar21) {
                  lVar21 = lVar1;
                }
                if (lVar16 <= lVar21) {
                  dVar25 = 1.0 / *(double *)(lVar11 + j * 8);
                  dVar24 = ABS(*(double *)(lVar10 + j * 8));
                  if (dVar24 <= dVar25) {
                    dVar24 = dVar25;
                  }
                  dVar25 = *(double *)((long)bbd_data + 0x20);
                  if (lVar18 < 1) {
                    lVar18 = 0;
                  }
                  lVar18 = lVar18 + -1;
                  do {
                    *(double *)((long)psVar17 + lVar18 * 8 + lVar22 + 8) =
                         (*(double *)(lVar13 + 8 + lVar18 * 8) -
                         *(double *)(lVar12 + 8 + lVar18 * 8)) * (1.0 / (dVar24 * dVar25));
                    lVar18 = lVar18 + 1;
                  } while (lVar18 < lVar21);
                }
                j = j + lVar19;
                lVar22 = lVar22 + ~(lVar7 + lVar6) * 8;
              } while (j < lVar8);
            }
            local_78 = local_78 + -8;
            bVar23 = lVar15 != lVar20;
            lVar15 = lVar15 + 1;
          } while (bVar23);
        }
        iVar9 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bbd_data + 0x48),
                                    *(SUNMatrix *)((long)bbd_data + 0x40));
        return iVar9;
      }
    }
LAB_0010dbda:
    msgfmt = "The gloc or gcomm routine failed in an unrecoverable manner.";
    iVar9 = 0x1ab;
  }
  else {
    msgfmt = "An error arose from a SUNBandMatrix routine.";
    iVar9 = 0x1a2;
  }
  KINProcessError(kin_mem,-1,iVar9,"KINBBDPrecSetup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                  ,msgfmt);
  return -1;
}

Assistant:

static int KINBBDPrecSetup(N_Vector uu, N_Vector uscale,
                           SUNDIALS_MAYBE_UNUSED N_Vector fval,
                           SUNDIALS_MAYBE_UNUSED N_Vector fscale, void* bbd_data)
{
  KBBDPrecData pdata;
  KINMem kin_mem;
  int retval;

  pdata = (KBBDPrecData)bbd_data;

  kin_mem = (KINMem)pdata->kin_mem;

  /* Call KBBDDQJac for a new Jacobian calculation and store in PP */
  retval = SUNMatZero(pdata->PP);
  if (retval != 0)
  {
    KINProcessError(kin_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_SUNMAT_FAIL);
    return (-1);
  }

  retval = KBBDDQJac(pdata, uu, uscale, pdata->tempv1, pdata->tempv2,
                     pdata->tempv3);
  if (retval != 0)
  {
    KINProcessError(kin_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_FUNC_FAILED);
    return (-1);
  }

  /* Do LU factorization of P and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->PP);
  return (retval);
}